

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_complexity.c
# Opt level: O0

void av1_setup_in_frame_q_adj(AV1_COMP *cpi)

{
  _Bool _Var1;
  int seg_data;
  AV1_COMP *in_RDI;
  bool bVar2;
  int qindex_delta;
  int aq_strength;
  int segment;
  int resolution_change;
  segmentation *seg;
  int base_qindex;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_28;
  segmentation *cpi_00;
  int in_stack_ffffffffffffffe8;
  int iVar3;
  AV1_COMP *cpi_01;
  
  cpi_01 = (AV1_COMP *)&in_RDI->common;
  iVar3 = (in_RDI->common).quant_params.base_qindex;
  cpi_00 = &(in_RDI->common).seg;
  bVar2 = false;
  if (((in_RDI->common).prev_frame != (RefCntBuffer *)0x0) &&
     (bVar2 = true, (in_RDI->common).width == ((in_RDI->common).prev_frame)->width)) {
    bVar2 = (in_RDI->common).height != ((in_RDI->common).prev_frame)->height;
  }
  if (bVar2) {
    memset((in_RDI->enc_seg).map,0,
           (long)((in_RDI->common).mi_params.mi_rows * (in_RDI->common).mi_params.mi_cols));
    av1_clearall_segfeatures((segmentation *)0x6e6853);
    av1_disable_segmentation(cpi_00);
  }
  else {
    _Var1 = is_frame_aq_enabled((AV1_COMP *)cpi_00);
    if (_Var1) {
      get_aq_c_strength(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      memset((in_RDI->enc_seg).map,3,
             (long)(*(int *)((cpi_01->enc_quant_dequant_params).quants.y_quant[0x20] + 2) *
                   *(int *)((cpi_01->enc_quant_dequant_params).quants.y_quant[0x20] + 4)));
      av1_clearall_segfeatures((segmentation *)0x6e68cb);
      _Var1 = is_sb_aq_enabled(in_RDI);
      if (_Var1) {
        av1_enable_segmentation(cpi_00);
        av1_disable_segfeature(cpi_00,3,'\0');
        for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
          if (local_28 != 3) {
            seg_data = av1_compute_qdelta_by_rate
                                 (cpi_01,(FRAME_TYPE)((uint)iVar3 >> 0x18),in_stack_ffffffffffffffe8
                                  ,(double)cpi_00);
            if ((iVar3 != 0) && (iVar3 + seg_data == 0)) {
              seg_data = 1 - iVar3;
            }
            if (0 < iVar3 + seg_data) {
              av1_enable_segfeature(cpi_00,local_28,'\0');
              av1_set_segdata(cpi_00,local_28,'\0',seg_data);
            }
          }
        }
      }
      else {
        av1_disable_segmentation(cpi_00);
      }
    }
  }
  return;
}

Assistant:

void av1_setup_in_frame_q_adj(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const int base_qindex = cm->quant_params.base_qindex;
  struct segmentation *const seg = &cm->seg;
  const int resolution_change =
      cm->prev_frame && (cm->width != cm->prev_frame->width ||
                         cm->height != cm->prev_frame->height);

  // Make SURE use of floating point in this function is safe.

  if (resolution_change) {
    memset(cpi->enc_seg.map, 0, cm->mi_params.mi_rows * cm->mi_params.mi_cols);
    av1_clearall_segfeatures(seg);
    av1_disable_segmentation(seg);
    return;
  }

  if (is_frame_aq_enabled(cpi)) {
    int segment;
    const int aq_strength =
        get_aq_c_strength(base_qindex, cm->seq_params->bit_depth);

    // Clear down the segment map.
    memset(cpi->enc_seg.map, DEFAULT_AQ2_SEG,
           cm->mi_params.mi_rows * cm->mi_params.mi_cols);

    av1_clearall_segfeatures(seg);

    if (!is_sb_aq_enabled(cpi)) {
      av1_disable_segmentation(seg);
      return;
    }

    av1_enable_segmentation(seg);

    // Default segment "Q" feature is disabled so it defaults to the baseline Q.
    av1_disable_segfeature(seg, DEFAULT_AQ2_SEG, SEG_LVL_ALT_Q);

    // Use some of the segments for in frame Q adjustment.
    for (segment = 0; segment < AQ_C_SEGMENTS; ++segment) {
      int qindex_delta;

      if (segment == DEFAULT_AQ2_SEG) continue;

      qindex_delta = av1_compute_qdelta_by_rate(
          cpi, cm->current_frame.frame_type, base_qindex,
          aq_c_q_adj_factor[aq_strength][segment]);

      // For AQ complexity mode, we dont allow Q0 in a segment if the base
      // Q is not 0. Q0 (lossless) implies 4x4 only and in AQ mode 2 a segment
      // Q delta is sometimes applied without going back around the rd loop.
      // This could lead to an illegal combination of partition size and q.
      if ((base_qindex != 0) && ((base_qindex + qindex_delta) == 0)) {
        qindex_delta = -base_qindex + 1;
      }
      if ((base_qindex + qindex_delta) > 0) {
        av1_enable_segfeature(seg, segment, SEG_LVL_ALT_Q);
        av1_set_segdata(seg, segment, SEG_LVL_ALT_Q, qindex_delta);
      }
    }
  }
}